

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::Node::Dump(Node *this,shared_ptr<Assimp::IOStream> *outfile,bool binary,int indent)

{
  element_type *peVar1;
  undefined7 in_register_00000011;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> _Stack_1c8;
  string s;
  StreamWriterLE outstream;
  
  if ((int)CONCAT71(in_register_00000011,binary) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&outstream);
    DumpAscii(this,(ostream *)&outstream,indent);
    std::__cxx11::stringbuf::str();
    peVar1 = (outfile->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar1->_vptr_IOStream[3])(peVar1,s._M_dataplus._M_p,s._M_string_length,1);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&outstream);
  }
  else {
    std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_1c8,
               &outfile->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
    StreamWriter<false,_false>::StreamWriter
              (&outstream,(shared_ptr<Assimp::IOStream> *)&_Stack_1c8,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1c8._M_refcount);
    DumpBinary(this,&outstream);
    StreamWriter<false,_false>::~StreamWriter(&outstream);
  }
  return;
}

Assistant:

void FBX::Node::Dump(
    std::shared_ptr<Assimp::IOStream> outfile,
    bool binary, int indent
) {
    if (binary) {
        Assimp::StreamWriterLE outstream(outfile);
        DumpBinary(outstream);
    } else {
        std::ostringstream ss;
        DumpAscii(ss, indent);
        std::string s = ss.str();
        outfile->Write(s.c_str(), s.size(), 1);
    }
}